

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

int __thiscall
crnlib::adaptive_arith_data_model::init(adaptive_arith_data_model *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  int extraout_EAX;
  uint uVar1;
  adaptive_bit_model *paVar2;
  uint in_EDX;
  long lVar3;
  
  if (in_EDX != 1) {
    if (in_EDX == 0) {
      this->m_total_syms = 0;
      paVar2 = (this->m_probs).m_p;
      if (paVar2 == (adaptive_bit_model *)0x0) {
        return in_EAX;
      }
      crnlib_free(paVar2);
      (this->m_probs).m_p = (adaptive_bit_model *)0x0;
      (this->m_probs).m_size = 0;
      (this->m_probs).m_capacity = 0;
      return extraout_EAX;
    }
    if ((in_EDX & in_EDX - 1) == 0) goto LAB_00190d99;
  }
  uVar1 = in_EDX - 1 >> 0x10 | in_EDX - 1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 2 | uVar1;
  in_EDX = (uVar1 >> 1 | uVar1) + 1;
LAB_00190d99:
  this->m_total_syms = in_EDX;
  uVar1 = (this->m_probs).m_size;
  paVar2 = (adaptive_bit_model *)(ulong)uVar1;
  if (uVar1 != in_EDX) {
    if (uVar1 <= in_EDX) {
      if ((this->m_probs).m_capacity < in_EDX) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_probs,in_EDX,uVar1 + 1 == in_EDX,2,
                   vector<crnlib::adaptive_bit_model>::object_mover,false);
      }
      uVar1 = (this->m_probs).m_size;
      paVar2 = (adaptive_bit_model *)(ulong)uVar1;
      uVar1 = in_EDX - uVar1;
      if (uVar1 != 0) {
        paVar2 = (this->m_probs).m_p + (long)paVar2;
        lVar3 = 0;
        do {
          *(undefined2 *)((long)&paVar2->m_bit_0_prob + lVar3) = 0x400;
          lVar3 = lVar3 + 2;
        } while ((ulong)uVar1 * 2 != lVar3);
      }
    }
    uVar1 = (uint)paVar2;
    (this->m_probs).m_size = in_EDX;
  }
  return uVar1;
}

Assistant:

void adaptive_arith_data_model::init(bool, uint total_syms) {
  if (!total_syms) {
    clear();
    return;
  }

  if ((total_syms < 2) || (!math::is_power_of_2(total_syms)))
    total_syms = math::next_pow2(total_syms);

  m_total_syms = total_syms;

  m_probs.resize(m_total_syms);
}